

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::SetCommentInfo::Deserialize(SetCommentInfo *this,Deserializer *deserializer)

{
  CatalogType CVar1;
  int iVar2;
  SetCommentInfo *this_00;
  pointer pSVar3;
  unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::SetCommentInfo_*,_false> local_70;
  Value local_68;
  
  this_00 = (SetCommentInfo *)operator_new(0xb8);
  SetCommentInfo(this_00);
  local_70._M_head_impl = this_00;
  pSVar3 = unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>::
           operator->((unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>
                       *)&local_70);
  (*deserializer->_vptr_Deserializer[2])(deserializer,300,"entry_catalog_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_68,deserializer);
    CVar1 = EnumUtil::FromString<duckdb::CatalogType>((char *)local_68.type_._0_8_);
    if ((char **)local_68.type_._0_8_ != (char **)((long)&local_68 + 0x10U)) {
      operator_delete((void *)local_68.type_._0_8_);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    CVar1 = (CatalogType)iVar2;
  }
  (pSVar3->super_AlterInfo).field_0x71 = CVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pSVar3 = unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>::
           operator->((unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>
                       *)&local_70);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x12d,"comment_value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_68,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  Value::operator=(&pSVar3->comment_value,&local_68);
  Value::~Value(&local_68);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> SetCommentInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetCommentInfo>(new SetCommentInfo());
	deserializer.ReadProperty<CatalogType>(300, "entry_catalog_type", result->entry_catalog_type);
	deserializer.ReadProperty<Value>(301, "comment_value", result->comment_value);
	return std::move(result);
}